

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall
ICM::Compiler::IdentifierAnalysis::setIdentifier(IdentifierAnalysis *this,Element *element)

{
  bool bVar1;
  uint uVar2;
  IdentBasicIndex IVar3;
  IdentTableUnit *pIVar4;
  IdentIndex ii;
  
  ii.ident_index = 0;
  ii.space_index = *GlobalIdentManager;
  bVar1 = isIdentDefined(this,&element->index,&ii);
  if (bVar1) {
    pIVar4 = getFromIdentTable(&ii);
    uVar2 = (pIVar4->type & 0xff) << 8 | 3;
  }
  else {
    IVar3 = insertFromIdentTable(ii.space_index,&element->index,I_DyVarb);
    ii.ident_index = IVar3;
    uVar2 = 0x403;
  }
  (element->field_0).type = uVar2;
  element->index = (uint_t)ii;
  return;
}

Assistant:

void setIdentifier(Element &element) {
				const IdentKey &key = element.getIndex();
				IdentIndex ii(getCurrentIdentSpaceIndex());
				if (isIdentDefined(key, ii)) {
					IdentTableUnit &itu = getFromIdentTable(ii);
					setIdent(element, itu.type, ii);
				}
				else {
					ii.ident_index = insertFromIdentTable(ii.space_index, key, I_DyVarb);
					setIdent(element, I_DyVarb, ii);
				}
			}